

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferBuilder.h
# Opt level: O0

void __thiscall
Js::BufferBuilderOf<int,_true>::Write
          (BufferBuilderOf<int,_true> *this,byte *buffer,uint32 bufferSize)

{
  byte *pbVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  bool bVar5;
  uint32 local_20;
  uint32 size;
  uint32 bufferSize_local;
  byte *buffer_local;
  BufferBuilderOf<int,_true> *this_local;
  
  bVar5 = UseOneByte(this);
  if (bVar5) {
    if (bufferSize == (this->super_BufferBuilder).offset) {
      Throw::FatalInternalError(-0x7fffbffb);
    }
    local_20 = 1;
    buffer[(this->super_BufferBuilder).offset] =
         (byte)*(undefined4 *)&(this->super_BufferBuilder).field_0x14;
  }
  else {
    bVar5 = UseTwoBytes(this);
    if (bVar5) {
      if (bufferSize - (this->super_BufferBuilder).offset < 3) {
        Throw::FatalInternalError(-0x7fffbffb);
      }
      local_20 = 3;
      buffer[(this->super_BufferBuilder).offset] = 0xfe;
      *(short *)(buffer + (ulong)(this->super_BufferBuilder).offset + 1) =
           (short)*(undefined4 *)&(this->super_BufferBuilder).field_0x14;
    }
    else {
      if (bufferSize - (this->super_BufferBuilder).offset < 5) {
        Throw::FatalInternalError(-0x7fffbffb);
      }
      buffer[(this->super_BufferBuilder).offset] = 0xff;
      uVar2 = (this->super_BufferBuilder).field_0x15;
      uVar3 = (this->super_BufferBuilder).field_0x16;
      uVar4 = (this->super_BufferBuilder).field_0x17;
      pbVar1 = buffer + (ulong)(this->super_BufferBuilder).offset + 1;
      pbVar1[0] = (this->super_BufferBuilder).field_0x14;
      pbVar1[1] = uVar2;
      pbVar1[2] = uVar3;
      pbVar1[3] = uVar4;
      local_20 = 5;
    }
  }
  BufferBuilder::TraceOutput(&this->super_BufferBuilder,buffer,local_20);
  return;
}

Assistant:

void Write(__in_bcount(bufferSize) byte * buffer, __in uint32 bufferSize) const
        {
            DebugOnly(uint32 size = sizeof(T));

#if INSTRUMENT_BUFFER_INTS
            if (value < ((1 << 8)))
            {
                Counts[0]++;
            }
            else if (value < ((1 << 16)))
            {
                Counts[1]++;
            }
            else if (value < ((1 << 24)))
            {
                Counts[2]++;
            }
            else
            {
                Counts[3]++;
            }
#endif

            if (useVariableIntEncoding)
            {
                if (UseOneByte())
                {
                    if (bufferSize - this->offset < sizeof(serialization_alignment byte))
                    {
                        Throw::FatalInternalError();
                    }
                    DebugOnly(size = sizeof(byte));
                    *(serialization_alignment byte*)(buffer + this->offset) = (byte) value;
                }
                else if (UseTwoBytes())
                {
                    if (bufferSize - this->offset < sizeof(serialization_alignment uint16) + sizeof(serialization_alignment byte))
                    {
                        Throw::FatalInternalError();
                    }
                    DebugOnly(size = sizeof(uint16) + 1);
                    *(serialization_alignment byte*)(buffer + this->offset) = TWO_BYTE_SENTINEL;
                    *(serialization_alignment uint16*)(buffer + this->offset + SENTINEL_BYTE_COUNT) = (uint16) this->value;
                }
                else
                {
                    if (bufferSize - this->offset < sizeof(serialization_alignment T) + sizeof(serialization_alignment byte))
                    {
                        Throw::FatalInternalError();
                    }
                    *(serialization_alignment byte*)(buffer + this->offset) = FOUR_BYTE_SENTINEL;
                    *(serialization_alignment T*)(buffer + this->offset + SENTINEL_BYTE_COUNT) = this->value;
                    DebugOnly(size = sizeof(T) + 1);
#if INSTRUMENT_BUFFER_INTS
                    Output::Print(_u("[BCGENSTATS] %d, %d\n"), value, sizeof(T));
#endif
                }
            }
            else
            {
                if (bufferSize - this->offset<sizeof(serialization_alignment T))
                {
                    Throw::FatalInternalError();
                }
                *(serialization_alignment T*)(buffer + this->offset) = value;
            }
            DebugOnly(TraceOutput(buffer, size));
        }